

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void units_reg(void)

{
  Symbol *pSVar1;
  char u [8192];
  double d2;
  double d1;
  Item *q;
  Symbol *s;
  char in_stack_ffffffffffffdfd8;
  undefined7 in_stack_ffffffffffffdfd9;
  List *in_stack_ffffffffffffdfe0;
  char *in_stack_ffffffffffffdff8;
  double *in_stack_ffffffffffffe000;
  double *in_stack_ffffffffffffe008;
  Symbol *in_stack_ffffffffffffe010;
  Item *local_10;
  
  lappendstr(in_stack_ffffffffffffdfe0,
             (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
  for (local_10 = syminorder->next; local_10 != syminorder; local_10 = local_10->next) {
    pSVar1 = (local_10->element).sym;
    if (((pSVar1->nrntype & 0x40U) != 0) &&
       (decode_ustr(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe000,
                    in_stack_ffffffffffffdff8), in_stack_ffffffffffffdfd8 != '\0')) {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,suffix,&stack0xffffffffffffdfd8);
      lappendstr(in_stack_ffffffffffffdfe0,
                 (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
    }
  }
  for (local_10 = rangeparm->next; local_10 != rangeparm; local_10 = local_10->next) {
    pSVar1 = (local_10->element).sym;
    decode_ustr(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe000,
                in_stack_ffffffffffffdff8);
    if (in_stack_ffffffffffffdfd8 != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,&stack0xffffffffffffdfd8);
      lappendstr(in_stack_ffffffffffffdfe0,
                 (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
    }
  }
  for (local_10 = rangestate->next; local_10 != rangestate; local_10 = local_10->next) {
    pSVar1 = (local_10->element).sym;
    decode_ustr(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe000,
                in_stack_ffffffffffffdff8);
    if (in_stack_ffffffffffffdfd8 != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,&stack0xffffffffffffdfd8);
      lappendstr(in_stack_ffffffffffffdfe0,
                 (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
    }
  }
  for (local_10 = rangedep->next; local_10 != rangedep; local_10 = local_10->next) {
    pSVar1 = (local_10->element).sym;
    decode_ustr(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe000,
                in_stack_ffffffffffffdff8);
    if (in_stack_ffffffffffffdfd8 != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,&stack0xffffffffffffdfd8);
      lappendstr(in_stack_ffffffffffffdfe0,
                 (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
    }
  }
  for (local_10 = nrnpointers->next; local_10 != nrnpointers; local_10 = local_10->next) {
    pSVar1 = (local_10->element).sym;
    decode_ustr(in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe000,
                in_stack_ffffffffffffdff8);
    if (in_stack_ffffffffffffdfd8 != '\0') {
      sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,&stack0xffffffffffffdfd8);
      lappendstr(in_stack_ffffffffffffdfe0,
                 (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
    }
  }
  lappendstr(in_stack_ffffffffffffdfe0,
             (char *)CONCAT71(in_stack_ffffffffffffdfd9,in_stack_ffffffffffffdfd8));
  return;
}

Assistant:

void units_reg() {
	Symbol* s;
	Item* q;
	double d1, d2;
	char u[NRN_BUFSIZE];
	
	Lappendstr(defs_list, "static HocParmUnits _hoc_parm_units[] = {\n");
	ITERATE (q, syminorder) {
		s = SYM(q);
		if (s->nrntype & NRNGLOBAL) {
			decode_ustr(s, &d1, &d2, u);
			if (u[0]) {
				sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, suffix, u);
				lappendstr(defs_list, buf);
			}
		}
	}
	ITERATE (q, rangeparm) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangestate) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangedep) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, nrnpointers) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "0,0\n};\n");
}